

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  
  pbVar2 = (byte *)in->data_;
  sVar6 = in->size_;
  if (sVar6 == 0) {
    uVar5 = 0;
    pbVar4 = pbVar2;
  }
  else {
    pbVar4 = pbVar2 + sVar6;
    uVar5 = 0;
    pbVar3 = pbVar2;
    do {
      bVar1 = *pbVar3;
      iVar7 = 2;
      if (0xf5 < (byte)(bVar1 - 0x3a)) {
        iVar7 = 1;
        if ((uVar5 < 0x199999999999999a) && (uVar5 != 0x1999999999999999 || bVar1 < 0x36)) {
          uVar5 = (ulong)(bVar1 & 0xf) + uVar5 * 10;
          iVar7 = 0;
        }
      }
      if (iVar7 != 0) {
        pbVar4 = pbVar3;
        if (iVar7 != 2) {
          return false;
        }
        break;
      }
      pbVar3 = pbVar3 + 1;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  *val = uVar5;
  uVar5 = (long)pbVar4 - (long)pbVar2;
  if (uVar5 <= in->size_) {
    in->data_ = (char *)(pbVar2 + uVar5);
    in->size_ = in->size_ - uVar5;
    return pbVar4 != pbVar2;
  }
  __assert_fail("n <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/include/leveldb/slice.h"
                ,0x45,"void leveldb::Slice::remove_prefix(size_t)");
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}